

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Lexer::ParseEllipse(Lexer *this)

{
  bool bVar1;
  int local_14;
  char c;
  int count;
  Lexer *this_local;
  
  local_14 = 0;
  while( true ) {
    bVar1 = IsEndOfText(this);
    if (bVar1 || 2 < local_14) {
      ParseWhitespaceAndNewlines(this);
      if (*this->m_current == '\r') {
        AdvanceCurrent(this);
      }
      bVar1 = IsEndOfText(this);
      if ((!bVar1) && (*this->m_current == '\n')) {
        AdvanceCurrent(this);
      }
      return;
    }
    if (*this->m_current != '.') break;
    local_14 = local_14 + 1;
    AdvanceCurrent(this);
  }
  Error<>(this,"Expected ellipse");
  return;
}

Assistant:

inline_t void Lexer::ParseEllipse()
	{
		int count = 0;
		while (!IsEndOfText() && count < 3)
		{
			char c = *m_current;
			if (c != '.')
			{
				Error("Expected ellipse");
				return;
			}
			++count;
			AdvanceCurrent();
		}
		ParseWhitespaceAndNewlines();
		if (*m_current == '\r')
			AdvanceCurrent();
		if (IsEndOfText())
			return;
		if (*m_current == '\n')
			AdvanceCurrent();
	}